

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

int32_t __thiscall icu_63::GregorianCalendar::handleGetExtendedYear(GregorianCalendar *this)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  int local_18;
  int32_t era;
  int32_t yearField;
  int32_t year;
  GregorianCalendar *this_local;
  
  local_18 = 0x13;
  if ((this->super_Calendar).fStamp[0x13] < (this->super_Calendar).fStamp[1]) {
    local_18 = 1;
  }
  if ((this->super_Calendar).fStamp[local_18] < (this->super_Calendar).fStamp[0x11]) {
    local_18 = 0x11;
  }
  if (local_18 == 1) {
    iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_ERA,1);
    if (iVar1 == 0) {
      iVar1 = Calendar::internalGet(&this->super_Calendar,UCAL_YEAR,1);
      era = 1 - iVar1;
    }
    else {
      era = Calendar::internalGet(&this->super_Calendar,UCAL_YEAR,0x7b2);
    }
  }
  else if (local_18 == 0x11) {
    uVar2 = Calendar::internalGet(&this->super_Calendar,UCAL_YEAR_WOY);
    uVar3 = Calendar::internalGet(&this->super_Calendar,UCAL_WEEK_OF_YEAR);
    era = (*(this->super_Calendar).super_UObject._vptr_UObject[0x26])
                    (this,(ulong)uVar2,(ulong)uVar3);
  }
  else if (local_18 == 0x13) {
    era = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR,0x7b2);
  }
  else {
    era = 0x7b2;
  }
  return era;
}

Assistant:

int32_t GregorianCalendar::handleGetExtendedYear() {
    // the year to return
    int32_t year = kEpochYear;

    // year field to use
    int32_t yearField = UCAL_EXTENDED_YEAR;

    // There are three separate fields which could be used to
    // derive the proper year.  Use the one most recently set.
    if (fStamp[yearField] < fStamp[UCAL_YEAR])
        yearField = UCAL_YEAR;
    if (fStamp[yearField] < fStamp[UCAL_YEAR_WOY])
        yearField = UCAL_YEAR_WOY;

    // based on the "best" year field, get the year
    switch(yearField) {
    case UCAL_EXTENDED_YEAR:
        year = internalGet(UCAL_EXTENDED_YEAR, kEpochYear);
        break;

    case UCAL_YEAR:
        {
            // The year defaults to the epoch start, the era to AD
            int32_t era = internalGet(UCAL_ERA, AD);
            if (era == BC) {
                year = 1 - internalGet(UCAL_YEAR, 1); // Convert to extended year
            } else {
                year = internalGet(UCAL_YEAR, kEpochYear);
            }
        }
        break;

    case UCAL_YEAR_WOY:
        year = handleGetExtendedYearFromWeekFields(internalGet(UCAL_YEAR_WOY), internalGet(UCAL_WEEK_OF_YEAR));
#if defined (U_DEBUG_CAL)
        //    if(internalGet(UCAL_YEAR_WOY) != year) {
        fprintf(stderr, "%s:%d: hGEYFWF[%d,%d] ->  %d\n", 
            __FILE__, __LINE__,internalGet(UCAL_YEAR_WOY),internalGet(UCAL_WEEK_OF_YEAR),year);
        //}
#endif
        break;

    default:
        year = kEpochYear;
    }
    return year;
}